

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  WriteFieldDocComment(printer,this->descriptor_);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "$deprecation$java.util.List<$type$> get$capitalized_name$List();\n");
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,"$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,"$deprecation$$type$ get$capitalized_name$(int index);\n");
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,
                       "$deprecation$java.util.List<java.lang.Integer>\nget$capitalized_name$ValueList();\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,variables,"$deprecation$int get$capitalized_name$Value(int index);\n"
                      );
    return;
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::
GenerateInterfaceMembers(io::Printer* printer) const {
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$java.util.List<$type$> get$capitalized_name$List();\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$$type$ get$capitalized_name$(int index);\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$java.util.List<java.lang.Integer>\n"
      "get$capitalized_name$ValueList();\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$int get$capitalized_name$Value(int index);\n");
  }
}